

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

void __thiscall
wasm::IRBuilder::fixLoopWithInput(IRBuilder *this,Loop *loop,Type inputType,Index scratch)

{
  char *pcVar1;
  Expression *any;
  optional<wasm::Type> type;
  Name name;
  Name name_00;
  Name name_01;
  Name label;
  bool bVar2;
  Break *append;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  Block *local_168;
  optional<wasm::Type> local_158;
  size_t local_148;
  size_t local_140;
  LocalSet *local_138;
  Break *local_130;
  initializer_list<wasm::Expression_*> local_128;
  size_t local_118;
  char *local_110;
  Block *local_108;
  Block *outer;
  undefined1 local_f8;
  size_t local_f0;
  size_t local_e8;
  Break *local_e0;
  initializer_list<wasm::Expression_*> local_d8;
  char *local_c8;
  char *local_c0;
  _Storage<wasm::Type,_true> local_b8;
  undefined8 local_b0;
  size_t local_a8;
  size_t local_a0;
  char *local_98;
  char *local_90;
  BasicType local_84;
  Block *local_80;
  Block *inner;
  char *local_70;
  undefined1 local_68 [8];
  Name l1;
  undefined1 local_48 [8];
  Name l0;
  Name l;
  Index scratch_local;
  Loop *loop_local;
  IRBuilder *this_local;
  Type inputType_local;
  
  l1.super_IString.str._M_str = (char *)(loop->name).super_IString.str._M_len;
  pcVar1 = (loop->name).super_IString.str._M_str;
  l0.super_IString.str._M_str = l1.super_IString.str._M_str;
  this_local = (IRBuilder *)inputType.id;
  _local_48 = (string_view)makeFresh(this,(Name)(loop->name).super_IString.str,0);
  inner = (Block *)l0.super_IString.str._M_str;
  label.super_IString.str._M_str = pcVar1;
  label.super_IString.str._M_len = (size_t)l0.super_IString.str._M_str;
  local_70 = pcVar1;
  _local_68 = (string_view)makeFresh(this,label,1);
  local_84 = none;
  bVar2 = wasm::Type::operator==
                    (&(loop->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.
                      type,&local_84);
  if (bVar2) {
    any = loop->body;
    local_98 = l0.super_IString.str._M_str;
    local_a8 = (size_t)local_68;
    local_a0 = l1.super_IString.str._M_len;
    local_90 = pcVar1;
    append = Builder::makeBreak(&this->builder,(Name)_local_68,(Expression *)0x0,(Expression *)0x0);
    std::optional<wasm::Type>::optional<wasm::Type_&,_true>
              ((optional<wasm::Type> *)&local_b8._M_value,(Type *)&this_local);
    name_01.super_IString.str._M_str = local_90;
    name_01.super_IString.str._M_len = (size_t)local_98;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = local_b0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = local_b8;
    local_168 = Builder::blockifyWithName(&this->builder,any,name_01,(Expression *)append,type);
  }
  else {
    local_c8 = l0.super_IString.str._M_str;
    local_f0 = (size_t)local_68;
    local_e8 = l1.super_IString.str._M_len;
    local_c0 = pcVar1;
    local_e0 = Builder::makeBreak(&this->builder,(Name)_local_68,loop->body,(Expression *)0x0);
    local_d8._M_array = (iterator)&local_e0;
    local_d8._M_len = 1;
    std::optional<wasm::Type>::optional<wasm::Type_&,_true>
              ((optional<wasm::Type> *)&outer,(Type *)&this_local);
    name_00.super_IString.str._M_str = local_c0;
    name_00.super_IString.str._M_len = (size_t)local_c8;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)outer;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_f8;
    local_168 = Builder::makeBlock(&this->builder,name_00,&local_d8,type_00);
  }
  local_80 = local_168;
  local_118 = (size_t)local_68;
  local_110 = (char *)l1.super_IString.str._M_len;
  local_138 = Builder::makeLocalSet(&this->builder,scratch,(Expression *)local_168);
  local_148 = (size_t)local_48;
  local_140 = l0.super_IString.str._M_len;
  local_130 = Builder::makeBreak(&this->builder,(Name)_local_48,(Expression *)0x0,(Expression *)0x0)
  ;
  local_128._M_array = (iterator)&local_138;
  local_128._M_len = 2;
  std::optional<wasm::Type>::optional<wasm::Type_&,_true>
            (&local_158,
             &(loop->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type);
  name.super_IString.str._M_str = local_110;
  name.super_IString.str._M_len = local_118;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_158.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_158.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  local_108 = Builder::makeBlock(&this->builder,name,&local_128,type_01);
  loop->body = (Expression *)local_108;
  wasm::Name::operator=(&loop->name,(Name *)local_48);
  return;
}

Assistant:

void IRBuilder::fixLoopWithInput(Loop* loop, Type inputType, Index scratch) {
  auto l = loop->name;
  auto l0 = makeFresh(l, 0);
  auto l1 = makeFresh(l, 1);

  Block* inner =
    loop->type == Type::none
      ? builder.blockifyWithName(
          loop->body, l, builder.makeBreak(l1), inputType)
      : builder.makeBlock(l, {builder.makeBreak(l1, loop->body)}, inputType);

  Block* outer = builder.makeBlock(
    l1,
    {builder.makeLocalSet(scratch, inner), builder.makeBreak(l0)},
    loop->type);

  loop->body = outer;
  loop->name = l0;
}